

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::InitializeProgressMarks(cmGlobalUnixMakefileGenerator3 *this)

{
  cmLocalGenerator *this_00;
  cmLocalGenerator *this_01;
  bool bVar1;
  TargetType TVar2;
  reference ppcVar3;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar4;
  mapped_type *this_02;
  reference this_03;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  byte local_164;
  bool local_14d;
  cmStateSnapshot local_138;
  _Base_ptr local_120;
  undefined1 local_118;
  cmGeneratorTarget *local_110;
  _Self local_108;
  _Self local_100;
  const_iterator ti;
  TargetDependSet *tgtdeps;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *targetSet;
  cmStateSnapshot tsnp;
  cmStateSnapshot csnp;
  string local_a0;
  cmLocalGenerator *local_70;
  cmLocalGenerator *tlg;
  cmGeneratorTarget *gt;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_58;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_50;
  const_iterator t;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmLocalGenerator *lg;
  __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_20;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_18;
  const_iterator lgi;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  lgi._M_current = (cmLocalGenerator **)this;
  std::
  map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
  ::clear(&this->DirectoryTargetsMap);
  local_20._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                 (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators);
  __gnu_cxx::
  __normal_iterator<cmLocalGenerator*const*,std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>>
  ::__normal_iterator<cmLocalGenerator**>
            ((__normal_iterator<cmLocalGenerator*const*,std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>>
              *)&local_18,&local_20);
  while( true ) {
    lg = (cmLocalGenerator *)
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                   (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&lg);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppcVar3;
    __x = cmLocalGenerator::GetGeneratorTargets(this_00);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t,__x);
    local_58._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
    ::__normal_iterator<cmGeneratorTarget**>
              ((__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
                *)&local_50,&local_58);
    while( true ) {
      gt = (cmGeneratorTarget *)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
      bVar1 = __gnu_cxx::operator!=
                        (&local_50,
                         (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)&gt);
      if (!bVar1) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_50);
      tlg = (cmLocalGenerator *)*ppcVar4;
      local_70 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)tlg);
      csnp.Position.Position._6_1_ = 0;
      csnp.Position.Position._5_1_ = 0;
      TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)tlg);
      this_01 = tlg;
      local_14d = true;
      if (TVar2 != INTERFACE_LIBRARY) {
        std::allocator<char>::allocator();
        csnp.Position.Position._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_a0,"EXCLUDE_FROM_ALL",
                   (allocator *)((long)&csnp.Position.Position + 7));
        csnp.Position.Position._5_1_ = 1;
        local_14d = cmGeneratorTarget::GetPropertyAsBool((cmGeneratorTarget *)this_01,&local_a0);
      }
      if ((csnp.Position.Position._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_a0);
      }
      if ((csnp.Position.Position._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&csnp.Position.Position + 7));
      }
      if (local_14d == false) {
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&tsnp.Position.Position,this_00);
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&targetSet,local_70);
        while( true ) {
          bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)&tsnp.Position.Position);
          local_164 = 0;
          if (bVar1) {
            bVar1 = cmGlobalGenerator::IsExcluded
                              ((cmGlobalGenerator *)this,(cmStateSnapshot *)&tsnp.Position.Position,
                               (cmStateSnapshot *)&targetSet);
            local_164 = bVar1 ^ 0xff;
          }
          if ((local_164 & 1) == 0) break;
          this_02 = std::
                    map<cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_std::set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>_>_>_>
                    ::operator[](&this->DirectoryTargetsMap,(key_type *)&tsnp.Position.Position);
          std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::insert(this_02,(value_type *)&tlg);
          ti._M_node = (_Base_ptr)
                       cmGlobalGenerator::GetTargetDirectDepends
                                 ((cmGlobalGenerator *)this,(cmGeneratorTarget *)tlg);
          local_100._M_node =
               (_Base_ptr)
               std::set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
               ::begin((set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                        *)ti._M_node);
          while( true ) {
            local_108._M_node =
                 (_Base_ptr)
                 std::
                 set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>::
                 end(ti._M_node);
            bVar1 = std::operator!=(&local_100,&local_108);
            if (!bVar1) break;
            this_03 = std::_Rb_tree_const_iterator<cmTargetDepend>::operator*(&local_100);
            local_110 = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(this_03);
            pVar5 = std::
                    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::insert(this_02,&local_110);
            local_120 = (_Base_ptr)pVar5.first._M_node;
            local_118 = pVar5.second;
            std::_Rb_tree_const_iterator<cmTargetDepend>::operator++(&local_100);
          }
          cmStateSnapshot::GetBuildsystemDirectoryParent
                    (&local_138,(cmStateSnapshot *)&tsnp.Position.Position);
        }
      }
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_50);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&t);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::InitializeProgressMarks()
{
  this->DirectoryTargetsMap.clear();
  // Loop over all targets in all local generators.
  for (std::vector<cmLocalGenerator*>::const_iterator lgi =
         this->LocalGenerators.begin();
       lgi != this->LocalGenerators.end(); ++lgi) {
    cmLocalGenerator* lg = *lgi;
    std::vector<cmGeneratorTarget*> targets = lg->GetGeneratorTargets();
    for (std::vector<cmGeneratorTarget*>::const_iterator t = targets.begin();
         t != targets.end(); ++t) {
      cmGeneratorTarget* gt = *t;

      cmLocalGenerator* tlg = gt->GetLocalGenerator();

      if (gt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
          gt->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
        continue;
      }

      cmStateSnapshot csnp = lg->GetStateSnapshot();
      cmStateSnapshot tsnp = tlg->GetStateSnapshot();

      // Consider the directory containing the target and all its
      // parents until something excludes the target.
      for (; csnp.IsValid() && !this->IsExcluded(csnp, tsnp);
           csnp = csnp.GetBuildsystemDirectoryParent()) {
        // This local generator includes the target.
        std::set<cmGeneratorTarget const*>& targetSet =
          this->DirectoryTargetsMap[csnp];
        targetSet.insert(gt);

        // Add dependencies of the included target.  An excluded
        // target may still be included if it is a dependency of a
        // non-excluded target.
        TargetDependSet const& tgtdeps = this->GetTargetDirectDepends(gt);
        for (TargetDependSet::const_iterator ti = tgtdeps.begin();
             ti != tgtdeps.end(); ++ti) {
          targetSet.insert(*ti);
        }
      }
    }
  }
}